

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<FileInfoCacheKey,QFileInfo>::emplace<QFileInfo_const&>
          (QHash<FileInfoCacheKey,_QFileInfo> *this,FileInfoCacheKey *key,QFileInfo *args)

{
  bool bVar1;
  QFileInfo *in_RDX;
  FileInfoCacheKey *in_RSI;
  QHash<FileInfoCacheKey,_QFileInfo> *in_RDI;
  long in_FS_OFFSET;
  QHash<FileInfoCacheKey,_QFileInfo> copy;
  QHash<FileInfoCacheKey,_QFileInfo> *in_stack_ffffffffffffff98;
  QHash<FileInfoCacheKey,_QFileInfo> *in_stack_ffffffffffffffa0;
  QFileInfo *in_stack_ffffffffffffffa8;
  FileInfoCacheKey *in_stack_ffffffffffffffb0;
  piter local_28;
  QFileInfo local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QHash<FileInfoCacheKey,_QFileInfo>::isDetached(in_stack_ffffffffffffffa0);
  if (bVar1) {
    bVar1 = QHashPrivate::Data<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_>::shouldGrow
                      (in_RDI->d);
    if (bVar1) {
      QFileInfo::QFileInfo(local_10,in_RDX);
      local_28 = (piter)QHash<FileInfoCacheKey,_QFileInfo>::emplace_helper<QFileInfo>
                                  (in_RDI,in_RSI,in_stack_ffffffffffffffa8);
      QFileInfo::~QFileInfo(local_10);
    }
    else {
      local_28 = (piter)emplace_helper<QFileInfo_const&>
                                  (in_RDI,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
  }
  else {
    QHash<FileInfoCacheKey,_QFileInfo>::QHash(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QHash<FileInfoCacheKey,_QFileInfo>::detach(in_stack_ffffffffffffffa0);
    local_28 = (piter)emplace_helper<QFileInfo_const&>
                                (in_RDI,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    QHash<FileInfoCacheKey,_QFileInfo>::~QHash(in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_28;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }